

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandRetime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nDelayLim;
  uint uVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  char *pcVar5;
  char *pcVar6;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pAVar4 = Abc_FrameReadNtk(pAbc);
  local_48 = 0;
  Extra_UtilGetoptReset();
  local_4c = 5;
  local_44 = 0;
  local_50 = 0;
  local_54 = 0;
  nDelayLim = 0;
LAB_00216f95:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"MDfbsvh");
    iVar3 = globalUtilOptind;
    if (iVar1 == 0x44) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-D\" should be followed by a positive integer.\n";
LAB_00217088:
        Abc_Print(-1,pcVar5);
        goto LAB_00217094;
      }
      nDelayLim = atoi(argv[globalUtilOptind]);
      uVar2 = nDelayLim;
    }
    else {
      if (0x65 < iVar1) {
        if (iVar1 == 0x66) {
          local_48 = local_48 ^ 1;
        }
        else if (iVar1 == 0x73) {
          local_50 = local_50 ^ 1;
        }
        else {
          if (iVar1 != 0x76) goto LAB_00217094;
          local_54 = local_54 ^ 1;
        }
        goto LAB_00216f95;
      }
      if (iVar1 == -1) {
        if (pAVar4 == (Abc_Ntk_t *)0x0) {
          pcVar5 = "Empty network.\n";
        }
        else {
          if (local_44 == 0 || local_48 == 0) {
            if (pAVar4->nObjCounts[8] == 0) {
              return 0;
            }
            if (local_4c < 7) {
              if (pAVar4->ntkType == ABC_NTK_STRASH) {
                iVar3 = Abc_NtkGetChoiceNum(pAVar4);
                if (iVar3 == 0) {
                  pAVar4 = Abc_NtkToLogic(pAVar4);
                  Abc_NtkRetime(pAVar4,local_4c,nDelayLim,local_48,local_44,local_50,local_54);
                  Abc_FrameReplaceCurrentNetwork(pAbc,pAVar4);
                  return 0;
                }
                pcVar5 = "Retiming with choice nodes is not implemented.\n";
              }
              else {
                iVar3 = Abc_NtkToSop(pAVar4,-1,1000000000);
                if (iVar3 == 0) {
                  pcVar5 = "Converting to SOPs has failed.\n";
                }
                else {
                  if (pAVar4->ntkType == ABC_NTK_LOGIC) {
                    Abc_NtkRetime(pAVar4,local_4c,nDelayLim,local_48,local_44,local_50,local_54);
                    return 0;
                  }
                  pcVar5 = "The network is not a logic network. Retiming is not performed.\n";
                }
              }
              Abc_Print(-1,pcVar5);
              return 0;
            }
            Abc_Print(-1,"The mode (%d) is incorrect. Retiming is not performed.\n",(ulong)local_4c)
            ;
            return 0;
          }
          pcVar5 = "Only one switch \"-f\" or \"-b\" can be selected at a time.\n";
        }
        iVar3 = -1;
        goto LAB_002171ef;
      }
      if (iVar1 != 0x4d) {
        if (iVar1 != 0x62) goto LAB_00217094;
        local_44 = local_44 ^ 1;
        goto LAB_00216f95;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-M\" should be followed by a positive integer.\n";
        goto LAB_00217088;
      }
      local_4c = atoi(argv[globalUtilOptind]);
      uVar2 = local_4c;
    }
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
LAB_00217094:
      Abc_Print(-2,"usage: retime [-MD num] [-fbvh]\n");
      Abc_Print(-2,"\t         retimes the current network using one of the algorithms:\n");
      Abc_Print(-2,"\t             1: most forward retiming\n");
      Abc_Print(-2,"\t             2: most backward retiming\n");
      Abc_Print(-2,"\t             3: forward and backward min-area retiming\n");
      Abc_Print(-2,"\t             4: forward and backward min-delay retiming\n");
      Abc_Print(-2,"\t             5: mode 3 followed by mode 4\n");
      Abc_Print(-2,"\t             6: Pan\'s optimum-delay retiming using binary search\n");
      Abc_Print(-2,"\t-M num : the retiming algorithm to use [default = %d]\n",(ulong)local_4c);
      Abc_Print(-2,"\t-D num : the minimum delay target (0=unused) [default = %d]\n",
                (ulong)nDelayLim);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (local_48 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-f     : enables forward-only retiming in modes 3,4,5 [default = %s]\n",pcVar5
               );
      pcVar5 = "yes";
      if (local_44 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-b     : enables backward-only retiming in modes 3,4,5 [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (local_50 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-s     : enables retiming one step only in mode 4 [default = %s]\n",pcVar5);
      if (local_54 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : enables verbose output [default = %s]\n",pcVar6);
      pcVar5 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_002171ef:
      Abc_Print(iVar3,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandRetime( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nMaxIters;
    int fForward;
    int fBackward;
    int fOneStep;
    int fVerbose;
    int Mode;
    int nDelayLim;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Mode      =  5;
    nDelayLim =  0;
    fForward  =  0;
    fBackward =  0;
    fOneStep  =  0;
    fVerbose  =  0;
    nMaxIters = 15;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MDfbsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            Mode = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Mode < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nDelayLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDelayLim < 0 )
                goto usage;
            break;
        case 'f':
            fForward ^= 1;
            break;
        case 'b':
            fBackward ^= 1;
            break;
        case 's':
            fOneStep ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fForward && fBackward )
    {
        Abc_Print( -1, "Only one switch \"-f\" or \"-b\" can be selected at a time.\n" );
        return 1;
    }

    if ( !Abc_NtkLatchNum(pNtk) )
    {
//        Abc_Print( -1, "The network has no latches. Retiming is not performed.\n" );
        return 0;
    }

    if ( Mode < 0 || Mode > 6 )
    {
        Abc_Print( -1, "The mode (%d) is incorrect. Retiming is not performed.\n", Mode );
        return 0;
    }

    if ( Abc_NtkIsStrash(pNtk) )
    {
        if ( Abc_NtkGetChoiceNum(pNtk) )
        {
            Abc_Print( -1, "Retiming with choice nodes is not implemented.\n" );
            return 0;
        }
        // convert the network into an SOP network
        pNtkRes = Abc_NtkToLogic( pNtk );
        // perform the retiming
        Abc_NtkRetime( pNtkRes, Mode, nDelayLim, fForward, fBackward, fOneStep, fVerbose );
        // replace the current network
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
        return 0;
    }

    // get the network in the SOP form
    if ( !Abc_NtkToSop(pNtk, -1, ABC_INFINITY) )
    {
        Abc_Print( -1, "Converting to SOPs has failed.\n" );
        return 0;
    }

    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "The network is not a logic network. Retiming is not performed.\n" );
        return 0;
    }

    // perform the retiming
    Abc_NtkRetime( pNtk, Mode, nDelayLim, fForward, fBackward, fOneStep, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: retime [-MD num] [-fbvh]\n" );
    Abc_Print( -2, "\t         retimes the current network using one of the algorithms:\n" );
    Abc_Print( -2, "\t             1: most forward retiming\n" );
    Abc_Print( -2, "\t             2: most backward retiming\n" );
    Abc_Print( -2, "\t             3: forward and backward min-area retiming\n" );
    Abc_Print( -2, "\t             4: forward and backward min-delay retiming\n" );
    Abc_Print( -2, "\t             5: mode 3 followed by mode 4\n" );
    Abc_Print( -2, "\t             6: Pan's optimum-delay retiming using binary search\n" );
    Abc_Print( -2, "\t-M num : the retiming algorithm to use [default = %d]\n", Mode );
    Abc_Print( -2, "\t-D num : the minimum delay target (0=unused) [default = %d]\n", nDelayLim );
    Abc_Print( -2, "\t-f     : enables forward-only retiming in modes 3,4,5 [default = %s]\n", fForward? "yes": "no" );
    Abc_Print( -2, "\t-b     : enables backward-only retiming in modes 3,4,5 [default = %s]\n", fBackward? "yes": "no" );
    Abc_Print( -2, "\t-s     : enables retiming one step only in mode 4 [default = %s]\n", fOneStep? "yes": "no" );
    Abc_Print( -2, "\t-v     : enables verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
//    Abc_Print( -2, "\t-I num : max number of iterations of l-value computation [default = %d]\n", nMaxIters );
//    Abc_Print( -2, "\t-f     : toggle forward retiming (for AIGs) [default = %s]\n", fForward? "yes": "no" );
//    Abc_Print( -2, "\t-b     : toggle backward retiming (for AIGs) [default = %s]\n", fBackward? "yes": "no" );
//    Abc_Print( -2, "\t-i     : toggle computation of initial state [default = %s]\n", fInitial? "yes": "no" );
}